

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_uri_key(char *zFilename,int N)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  
  if (N < 0 || zFilename == (char *)0x0) {
    return (char *)0x0;
  }
  do {
    do {
      pcVar6 = zFilename;
      zFilename = pcVar6 + -1;
    } while (pcVar6[-1] != '\0');
  } while (((pcVar6[-2] != '\0') || (pcVar6[-3] != '\0')) || (pcVar6[-4] != '\0'));
  sVar2 = strlen(pcVar6);
  pcVar6 = pcVar6 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
  cVar5 = *pcVar6;
  if (0 < N && cVar5 != '\0') {
    do {
      sVar2 = strlen(pcVar6);
      sVar3 = strlen(pcVar6 + (sVar2 & 0x3fffffff) + 1);
      pcVar6 = pcVar6 + (sVar3 & 0x3fffffff) + (sVar2 & 0x3fffffff) + 2;
      cVar5 = *pcVar6;
      if (cVar5 == '\0') break;
      bVar1 = 1 < N;
      N = N + -1;
    } while (bVar1);
  }
  pcVar4 = (char *)0x0;
  if (cVar5 != '\0') {
    pcVar4 = pcVar6;
  }
  return pcVar4;
}

Assistant:

SQLITE_API const char *sqlite3_uri_key(const char *zFilename, int N){
  if( zFilename==0 || N<0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] && (N--)>0 ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename[0] ? zFilename : 0;
}